

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

void __thiscall spoa::Graph::AddEdge(Graph *this,Node *tail,Node *head,uint32_t weight)

{
  pointer ppEVar1;
  Edge *pEVar2;
  _Head_base<0UL,_spoa::Graph::Edge_*,_false> local_38;
  
  ppEVar1 = (tail->outedges).
            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (ppEVar1 ==
        (tail->outedges).
        super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pEVar2 = (Edge *)operator_new(0x30);
      Edge::Edge(pEVar2,tail,head,
                 (uint32_t)
                 ((ulong)((long)(this->sequences_).
                                super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->sequences_).
                               super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3),weight);
      local_38._M_head_impl = pEVar2;
      std::
      vector<std::unique_ptr<spoa::Graph::Edge,std::default_delete<spoa::Graph::Edge>>,std::allocator<std::unique_ptr<spoa::Graph::Edge,std::default_delete<spoa::Graph::Edge>>>>
      ::emplace_back<spoa::Graph::Edge*>
                ((vector<std::unique_ptr<spoa::Graph::Edge,std::default_delete<spoa::Graph::Edge>>,std::allocator<std::unique_ptr<spoa::Graph::Edge,std::default_delete<spoa::Graph::Edge>>>>
                  *)&this->edges_,&local_38._M_head_impl);
      local_38._M_head_impl =
           (this->edges_).
           super__Vector_base<std::unique_ptr<spoa::Graph::Edge,_std::default_delete<spoa::Graph::Edge>_>,_std::allocator<std::unique_ptr<spoa::Graph::Edge,_std::default_delete<spoa::Graph::Edge>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<spoa::Graph::Edge,_std::default_delete<spoa::Graph::Edge>_>._M_t.
           super__Tuple_impl<0UL,_spoa::Graph::Edge_*,_std::default_delete<spoa::Graph::Edge>_>.
           super__Head_base<0UL,_spoa::Graph::Edge_*,_false>._M_head_impl;
      std::vector<spoa::Graph::Edge*,std::allocator<spoa::Graph::Edge*>>::
      emplace_back<spoa::Graph::Edge*>
                ((vector<spoa::Graph::Edge*,std::allocator<spoa::Graph::Edge*>> *)&tail->outedges,
                 &local_38._M_head_impl);
      local_38._M_head_impl =
           (this->edges_).
           super__Vector_base<std::unique_ptr<spoa::Graph::Edge,_std::default_delete<spoa::Graph::Edge>_>,_std::allocator<std::unique_ptr<spoa::Graph::Edge,_std::default_delete<spoa::Graph::Edge>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<spoa::Graph::Edge,_std::default_delete<spoa::Graph::Edge>_>._M_t.
           super__Tuple_impl<0UL,_spoa::Graph::Edge_*,_std::default_delete<spoa::Graph::Edge>_>.
           super__Head_base<0UL,_spoa::Graph::Edge_*,_false>._M_head_impl;
      std::vector<spoa::Graph::Edge*,std::allocator<spoa::Graph::Edge*>>::
      emplace_back<spoa::Graph::Edge*>
                ((vector<spoa::Graph::Edge*,std::allocator<spoa::Graph::Edge*>> *)&head->inedges,
                 &local_38._M_head_impl);
      return;
    }
    pEVar2 = *ppEVar1;
    ppEVar1 = ppEVar1 + 1;
  } while (pEVar2->head != head);
  Edge::AddSequence(pEVar2,(uint32_t)
                           ((ulong)((long)(this->sequences_).
                                          super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->sequences_).
                                         super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3),weight);
  return;
}

Assistant:

void Graph::AddEdge(Node* tail, Node* head, std::uint32_t weight) {
  for (const auto& it : tail->outedges) {
    if (it->head == head) {
      it->AddSequence(sequences_.size(), weight);
      return;
    }
  }
  edges_.emplace_back(new Edge(tail, head, sequences_.size(), weight));
  tail->outedges.emplace_back(edges_.back().get());
  head->inedges.emplace_back(edges_.back().get());
}